

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetJacFn(void *arkode_mem,ARKLsJacFn jac)

{
  int iVar1;
  void *pvVar2;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x227;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x128) != 0) {
      iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetJacFn",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (jac == (ARKLsJacFn)0x0) {
        arkls_mem->jacDQ = 1;
        arkls_mem->jac = arkLsDQJac;
        pvVar2 = arkode_mem;
      }
      else {
        if (arkls_mem->A == (SUNMatrix)0x0) {
          msgfmt = "Jacobian routine cannot be supplied for NULL SUNMatrix";
          error_code = -3;
          iVar1 = 0x23c;
          goto LAB_00140ac8;
        }
        arkls_mem->jacDQ = 0;
        arkls_mem->jac = jac;
        pvVar2 = *(void **)((long)arkode_mem + 0x10);
      }
      arkls_mem->J_data = pvVar2;
      arkls_mem->user_linsys = 0;
      arkls_mem->linsys = arkLsLinSys;
      arkls_mem->A_data = arkode_mem;
      return 0;
    }
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x230;
  }
LAB_00140ac8:
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetJacFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetJacFn(void* arkode_mem, ARKLsJacFn jac)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (arkls_mem->A == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (ARKLS_ILL_INPUT);
  }

  /* set the Jacobian routine pointer, and update relevant flags */
  if (jac != NULL)
  {
    arkls_mem->jacDQ  = SUNFALSE;
    arkls_mem->jac    = jac;
    arkls_mem->J_data = ark_mem->user_data;
  }
  else
  {
    arkls_mem->jacDQ  = SUNTRUE;
    arkls_mem->jac    = arkLsDQJac;
    arkls_mem->J_data = ark_mem;
  }

  /* ensure the internal linear system function is used */
  arkls_mem->user_linsys = SUNFALSE;
  arkls_mem->linsys      = arkLsLinSys;
  arkls_mem->A_data      = ark_mem;

  return (ARKLS_SUCCESS);
}